

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gest_trainer.cpp
# Opt level: O1

bool __thiscall
Am_Gesture_Trainer::Add_Class(Am_Gesture_Trainer *this,Am_String *classname,bool unique)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  Am_Gesture_Trainer_Data *pAVar3;
  Gesture_Class *this_00;
  Am_String AStack_38;
  Am_String local_30;
  
  if (this->data == (Am_Gesture_Trainer_Data *)0x0) {
    pAVar3 = (Am_Gesture_Trainer_Data *)operator_new(0x30);
    Am_Gesture_Trainer_Data::Am_Gesture_Trainer_Data(pAVar3);
  }
  else {
    if (!unique) goto LAB_001a6239;
    iVar2 = (*(this->data->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type[5])()
    ;
    pAVar3 = (Am_Gesture_Trainer_Data *)CONCAT44(extraout_var,iVar2);
  }
  this->data = pAVar3;
LAB_001a6239:
  pAVar3 = this->data;
  Am_String::Am_String(&AStack_38,classname);
  this_00 = pAVar3->head;
  if (this_00 == (Gesture_Class *)0x0) {
    bVar1 = true;
  }
  else {
    do {
      bVar1 = Am_String::operator==(&this_00->name,&AStack_38);
      if (bVar1) break;
      this_00 = this_00->next;
    } while (this_00 != (Gesture_Class *)0x0);
    bVar1 = !bVar1;
  }
  Am_String::~Am_String(&AStack_38);
  if (bVar1 != false) {
    pAVar3 = this->data;
    Am_String::Am_String(&local_30,classname);
    Am_Gesture_Trainer_Data::Add_Class(pAVar3,&local_30);
    Am_String::~Am_String(&local_30);
    Am_Gesture_Classifier::operator=
              (&this->data->cached_classifier,(Am_Gesture_Classifier_Data *)0x0);
  }
  return bVar1;
}

Assistant:

bool
Am_Gesture_Trainer::Add_Class(Am_String classname, bool unique)
{
  if (!data)
    data = new Am_Gesture_Trainer_Data();
  else if (unique)
    data = (Am_Gesture_Trainer_Data *)data->Make_Unique();

  if (data->Find_Class(classname))
    return false; // class already exists

  data->Add_Class(classname);

  data->cached_classifier = nullptr;
  return true;
}